

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O3

NewObject * __thiscall
ObjTable<QPDFWriter::NewObject>::element(ObjTable<QPDFWriter::NewObject> *this,size_t idx)

{
  pointer pNVar1;
  NewObject *pNVar2;
  runtime_error *this_00;
  ulong local_18;
  
  local_18 = idx;
  if (element(unsigned_long)::max_size == '\0') {
    element();
  }
  pNVar1 = (this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>).
           super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_18 <
      (ulong)((long)(this->
                    super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>).
                    super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 5)) {
    pNVar2 = pNVar1 + local_18;
  }
  else {
    if (element::max_size <= local_18) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Impossibly large object id encountered accessing ObjTable");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pNVar2 = std::
             map<unsigned_long,_QPDFWriter::NewObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
             ::at(&this->sparse_elements,&local_18);
  }
  return pNVar2;
}

Assistant:

inline T const&
    element(size_t idx) const
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < std::vector<T>::size()) {
            return std::vector<T>::operator[](idx);
        }
        if (idx < max_size) {
            return sparse_elements.at(idx);
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }